

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O3

void object_destroy(object obj)

{
  threading_atomic_ref_count_type *ptVar1;
  object_impl_interface_destroy p_Var2;
  char *pcVar3;
  
  if (obj != (object)0x0) {
    ptVar1 = &obj->ref;
    if ((obj->ref).count == 0) {
      pcVar3 = "<anonymous>";
      if (obj->name != (char *)0x0) {
        pcVar3 = obj->name;
      }
      log_write_impl_va("metacall",0x18a,"object_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,3,"Invalid reference counter in object: %s",pcVar3);
    }
    else {
      LOCK();
      ptVar1->count = ptVar1->count - 1;
      UNLOCK();
      LOCK();
      object_stats.decrements = object_stats.decrements + 1;
      UNLOCK();
    }
    if (ptVar1->count == 0) {
      if ((obj->interface != (object_interface)0x0) &&
         (p_Var2 = obj->interface->destroy, p_Var2 != (object_impl_interface_destroy)0x0)) {
        (*p_Var2)(obj,obj->impl);
      }
      if (obj->name != (char *)0x0) {
        free(obj->name);
      }
      free(obj);
      LOCK();
      object_stats.deallocations = object_stats.deallocations + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void object_destroy(object obj)
{
	if (obj != NULL)
	{
		if (object_decrement_reference(obj) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid reference counter in object: %s", obj->name ? obj->name : "<anonymous>");
		}

		if (threading_atomic_ref_count_load(&obj->ref) == 0)
		{
			/* TODO: Disable logs here until log is completely thread safe and async signal safe */

			/*
			if (obj->name == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy anonymous object <%p>", (void *)obj);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Destroy object %s <%p>", obj->name, (void *)obj);
			}
			*/

			if (obj->interface != NULL && obj->interface->destroy != NULL)
			{
				obj->interface->destroy(obj, obj->impl);
			}

			if (obj->name != NULL)
			{
				free(obj->name);
			}

			threading_atomic_ref_count_destroy(&obj->ref);

			free(obj);

			reflect_memory_tracker_deallocation(object_stats);
		}
	}
}